

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O0

void __thiscall
AbstractTxIn_ConstractorGetterSetter_Test::TestBody(AbstractTxIn_ConstractorGetterSetter_Test *this)

{
  AbstractTxIn local_268;
  undefined1 local_1d8 [8];
  AbstractTxIn actual_1;
  AbstractTxIn local_138;
  undefined1 local_a8 [8];
  AbstractTxIn actual;
  anon_class_1_0_00000001 check;
  AbstractTxIn_ConstractorGetterSetter_Test *this_local;
  
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)local_a8,&expect_txid,1,0xffffffff,&expect_unlocking_script);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_138,(AbstractTxIn *)local_a8);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&actual.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_138);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_138);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_a8);
  cfd::core::AbstractTxIn::AbstractTxIn((AbstractTxIn *)local_1d8,&expect_txid,1,0xffffffff);
  cfd::core::AbstractTxIn::SetUnlockingScript((Script *)local_1d8);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_268,(AbstractTxIn *)local_1d8);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&actual.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_268);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_268);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_1d8);
  return;
}

Assistant:

TEST(AbstractTxIn, ConstractorGetterSetter) {
  const auto check = [](AbstractTxIn actual) -> void {
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetVout());
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetOutPoint().GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
    EXPECT_EQ(expect_sequence, actual.GetSequence());
    EXPECT_STREQ(expect_script_hex.c_str(),
        actual.GetUnlockingScript().GetScript().GetHex().c_str());
  };

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence,
                                       expect_unlocking_script);
    check(actual);
  }

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence);
    actual.SetUnlockingScript(expect_unlocking_script);
    check(actual);
  }
}